

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall
QPlainTextDocumentLayoutPrivate::QPlainTextDocumentLayoutPrivate
          (QPlainTextDocumentLayoutPrivate *this)

{
  QAbstractTextDocumentLayoutPrivate *in_RDI;
  
  QAbstractTextDocumentLayoutPrivate::QAbstractTextDocumentLayoutPrivate(in_RDI);
  *(undefined ***)in_RDI = &PTR__QPlainTextDocumentLayoutPrivate_00d1d9b8;
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  *(undefined4 *)(in_RDI + 0xa8) = 0;
  *(undefined4 *)(in_RDI + 0xac) = 1;
  in_RDI[0xb9] = (QAbstractTextDocumentLayoutPrivate)0x0;
  in_RDI[0xb8] = (QAbstractTextDocumentLayoutPrivate)0x0;
  *(undefined4 *)(in_RDI + 0xbc) = 1;
  *(undefined4 *)(in_RDI + 0xc0) = 0;
  return;
}

Assistant:

QPlainTextDocumentLayoutPrivate() {
        mainViewPrivate = nullptr;
        width = 0;
        maximumWidth = 0;
        maximumWidthBlockNumber = 0;
        blockCount = 1;
        blockUpdate = blockDocumentSizeChanged = false;
        cursorWidth = 1;
        textLayoutFlags = 0;
    }